

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_block_statemach(connectdata *conn,_Bool disconnecting)

{
  imap_conn *imapc;
  CURLcode result;
  _Bool disconnecting_local;
  connectdata *conn_local;
  
  imapc._0_4_ = CURLE_OK;
  while ((conn->proto).imapc.state != IMAP_STOP && (CURLcode)imapc == CURLE_OK) {
    imapc._0_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,disconnecting);
  }
  return (CURLcode)imapc;
}

Assistant:

static CURLcode imap_block_statemach(struct connectdata *conn,
                                     bool disconnecting)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  while(imapc->state != IMAP_STOP && !result)
    result = Curl_pp_statemach(&imapc->pp, TRUE, disconnecting);

  return result;
}